

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTArithmeticExpression.cpp
# Opt level: O2

void __thiscall
MathML::AST::ArithmeticExpression::setOperator(ArithmeticExpression *this,String *op)

{
  __type _Var1;
  Operator OVar2;
  
  _Var1 = std::operator==(op,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             OPERATOR_ARITHMETIC_ADD_abi_cxx11_);
  OVar2 = ADD;
  if (!_Var1) {
    _Var1 = std::operator==(op,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               OPERATOR_ARITHMETIC_SUB_abi_cxx11_);
    if (_Var1) {
      OVar2 = SUB;
    }
    else {
      _Var1 = std::operator==(op,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)OPERATOR_ARITHMETIC_MUL_abi_cxx11_);
      if (_Var1) {
        OVar2 = MUL;
      }
      else {
        _Var1 = std::operator==(op,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)OPERATOR_ARITHMETIC_DIV_abi_cxx11_);
        if (!_Var1) {
          return;
        }
        OVar2 = DIV;
      }
    }
  }
  this->mOperator = OVar2;
  return;
}

Assistant:

void ArithmeticExpression::setOperator( const String& op )
        {
            if ( op == OPERATOR_ARITHMETIC_ADD )
            {
                mOperator = ADD;
            }

            else if ( op == OPERATOR_ARITHMETIC_SUB )
            {
                mOperator = SUB;
            }

            else if ( op == OPERATOR_ARITHMETIC_MUL )
            {
                mOperator = MUL;
            }

            else if ( op == OPERATOR_ARITHMETIC_DIV )
            {
                mOperator = DIV;
            }
        }